

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_evalfile(t_symbol *name,t_symbol *dir)

{
  _class **pp_Var1;
  _class **pp_Var2;
  int iVar3;
  int iVar4;
  _binbuf *b;
  t_atom *ptVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  t_symbol *ptVar9;
  _binbuf *p_Var10;
  char *pcVar11;
  bool bVar12;
  
  b = (_binbuf *)getbytes(0x10);
  b->b_n = 0;
  ptVar5 = (t_atom *)getbytes(0);
  b->b_vec = ptVar5;
  pcVar11 = name->s_name;
  sVar6 = strlen(pcVar11);
  pcVar11 = pcVar11 + (sVar6 - 4);
  iVar3 = strcmp(pcVar11,".pat");
  if (iVar3 == 0) {
    bVar12 = true;
  }
  else {
    iVar3 = strcmp(pcVar11,".mxt");
    bVar12 = iVar3 == 0;
  }
  iVar3 = canvas_suspend_dsp();
  glob_setfilename((void *)0x0,name,dir);
  iVar4 = binbuf_read(b,name->s_name,dir->s_name,0);
  p_Var10 = b;
  if (iVar4 == 0) {
    ptVar9 = gensym("#A");
    pp_Var2 = s__N.s_thing;
    pp_Var1 = ptVar9->s_thing;
    ptVar9 = gensym("#A");
    ptVar9->s_thing = (_class **)0x0;
    s__N.s_thing = &pd_canvasmaker;
    if (bVar12) {
      p_Var10 = binbuf_convert(b,1);
      freebytes(b->b_vec,(long)b->b_n << 4);
      freebytes(b,0x10);
    }
    binbuf_eval(p_Var10,(t_pd *)0x0,0,(t_atom *)0x0);
    if ((s__X.s_thing != (_class **)0x0) && (*s__X.s_thing == canvas_class)) {
      canvas_initbang((_glist *)s__X.s_thing);
    }
    ptVar9 = gensym("#A");
    ptVar9->s_thing = pp_Var1;
    s__N.s_thing = pp_Var2;
  }
  else {
    pcVar11 = name->s_name;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    pd_error((void *)0x0,"%s: read failed; %s",pcVar11,pcVar8);
  }
  glob_setfilename((void *)0x0,&s_,&s_);
  freebytes(p_Var10->b_vec,(long)p_Var10->b_n << 4);
  freebytes(p_Var10,0x10);
  canvas_resume_dsp(iVar3);
  return;
}

Assistant:

void binbuf_evalfile(t_symbol *name, t_symbol *dir)
{
    t_binbuf *b = binbuf_new();
    int import = !strcmp(name->s_name + strlen(name->s_name) - 4, ".pat") ||
        !strcmp(name->s_name + strlen(name->s_name) - 4, ".mxt");
    int dspstate = canvas_suspend_dsp();
        /* set filename so that new canvases can pick them up */
    glob_setfilename(0, name, dir);
    if (binbuf_read(b, name->s_name, dir->s_name, 0))
        pd_error(0, "%s: read failed; %s", name->s_name, strerror(errno));
    else
    {
            /* save bindings of symbols #N, #A (and restore afterward) */
        t_pd *bounda = gensym("#A")->s_thing, *boundn = s__N.s_thing;
        gensym("#A")->s_thing = 0;
        s__N.s_thing = &pd_canvasmaker;
        if (import)
        {
            t_binbuf *newb = binbuf_convert(b, 1);
            binbuf_free(b);
            b = newb;
        }
        binbuf_eval(b, 0, 0, 0);
            /* avoid crashing if no canvas was created by binbuf eval */
        if (s__X.s_thing && *s__X.s_thing == canvas_class)
            canvas_initbang((t_canvas *)(s__X.s_thing)); /* JMZ*/
        gensym("#A")->s_thing = bounda;
        s__N.s_thing = boundn;
    }
    glob_setfilename(0, &s_, &s_);
    binbuf_free(b);
    canvas_resume_dsp(dspstate);
}